

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

bool __thiscall
google::protobuf::internal::GeneratedExtensionFinder::Find
          (GeneratedExtensionFinder *this,int number,ExtensionInfo *output)

{
  MessageLite *pMVar1;
  long lVar2;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long *plVar7;
  
  if ((anonymous_namespace)::global_registry != (long *)0x0) {
    uVar5 = (long)number ^ (ulong)this->extendee_;
    uVar4 = uVar5 % (ulong)(anonymous_namespace)::global_registry[1];
    plVar7 = *(long **)(*(anonymous_namespace)::global_registry + uVar4 * 8);
    if (plVar7 != (long *)0x0) {
      plVar7 = (long *)*plVar7;
      uVar6 = plVar7[6];
      do {
        if (((uVar6 == uVar5) && ((MessageLite *)plVar7[1] == this->extendee_)) &&
           ((int)plVar7[2] == number)) {
          output->descriptor = (FieldDescriptor *)plVar7[5];
          pMVar1 = (MessageLite *)plVar7[1];
          lVar2 = plVar7[2];
          pvVar3 = (void *)plVar7[4];
          (output->field_5).enum_validity_check.func = (EnumValidityFuncWithArg *)plVar7[3];
          (output->field_5).enum_validity_check.arg = pvVar3;
          output->message = pMVar1;
          output->number = (int)lVar2;
          output->type = (char)((ulong)lVar2 >> 0x20);
          output->is_repeated = (bool)(char)((ulong)lVar2 >> 0x28);
          output->is_packed = (bool)(char)((ulong)lVar2 >> 0x30);
          output->field_0xf = (char)((ulong)lVar2 >> 0x38);
          return true;
        }
        plVar7 = (long *)*plVar7;
        if (plVar7 == (long *)0x0) {
          return false;
        }
        uVar6 = plVar7[6];
      } while (uVar6 % (ulong)(anonymous_namespace)::global_registry[1] == uVar4);
    }
  }
  return false;
}

Assistant:

const ExtensionInfo* FindRegisteredExtension(const MessageLite* extendee,
                                             int number) {
  if (!global_registry) return nullptr;

  ExtensionInfo info;
  info.message = extendee;
  info.number = number;

  auto it = global_registry->find(info);
  if (it == global_registry->end()) {
    return nullptr;
  } else {
    return &*it;
  }
}